

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slider.cpp
# Opt level: O2

int __thiscall QtMWidgets::SliderPrivate::init(SliderPrivate *this,EVP_PKEY_CTX *ctx)

{
  undefined8 uVar1;
  int iVar2;
  QPalette *this_00;
  QColor *pQVar3;
  QSizePolicy sp;
  QWidget local_18 [8];
  
  QWidget::fontMetrics(local_18);
  iVar2 = QFontMetrics::ascent();
  this->radius = iVar2;
  QFontMetrics::~QFontMetrics((QFontMetrics *)local_18);
  sp.field_0 = (anon_union_4_2_313b0b05_for_QSizePolicy_1)(Bits)0x70000;
  iVar2 = QAbstractSlider::orientation();
  if (iVar2 == 2) {
    QSizePolicy::transpose(&sp);
  }
  QWidget::setSizePolicy((QSizePolicy)SUB84(this->q,0));
  this_00 = (QPalette *)QWidget::palette();
  pQVar3 = QPalette::color(this_00,Highlight);
  uVar1 = *(undefined8 *)((long)&pQVar3->ct + 2);
  *(undefined8 *)&this->highlightColor = *(undefined8 *)pQVar3;
  *(undefined8 *)((long)&(this->highlightColor).ct + 2) = uVar1;
  return (int)uVar1;
}

Assistant:

void
SliderPrivate::init()
{
	radius = q->fontMetrics().ascent();

	QSizePolicy sp( QSizePolicy::Expanding, QSizePolicy::Fixed );

	if( q->orientation() == Qt::Vertical )
		sp.transpose();

	q->setSizePolicy( sp );

	highlightColor = q->palette().color( QPalette::Highlight );
}